

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ge.cpp
# Opt level: O2

void ge_scalarmult_base(ge_p3 *h,uchar *a)

{
  long lVar1;
  char cVar2;
  fd_set *__exceptfds;
  int iVar3;
  uint uVar4;
  byte bVar5;
  timeval *in_R8;
  ulong uVar6;
  fd_set *__readfds;
  char e [64];
  ge_precomp t;
  ge_p1p1 r;
  ge_p2 s;
  
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 1) {
    bVar5 = a[lVar1];
    e[lVar1 * 2] = bVar5 & 0xf;
    e[lVar1 * 2 + 1] = bVar5 >> 4;
  }
  __exceptfds = (fd_set *)0x0;
  for (lVar1 = 0; lVar1 != 0x3f; lVar1 = lVar1 + 1) {
    cVar2 = (char)__exceptfds + e[lVar1];
    iVar3 = (int)CONCAT71((int7)((ulong)__exceptfds >> 8),cVar2) + 8;
    bVar5 = (byte)iVar3;
    __exceptfds = (fd_set *)(ulong)CONCAT31((int3)((uint)iVar3 >> 8),(char)bVar5 >> 4);
    e[lVar1] = cVar2 - (bVar5 & 0xf0);
  }
  e[0x3f] = e[0x3f] + (char)__exceptfds;
  ge_p3_0(h);
  uVar4 = 0;
  for (uVar6 = 1; uVar6 < 0x40; uVar6 = uVar6 + 2) {
    select((int)&t,(fd_set *)(ulong)uVar4,(fd_set *)(ulong)(uint)(int)e[uVar6],__exceptfds,in_R8);
    ge_madd(&r,h,&t);
    ge_p1p1_to_p3(h,&r);
    uVar4 = uVar4 + 1;
  }
  ge_p3_dbl(&r,h);
  ge_p1p1_to_p2(&s,&r);
  ge_p2_dbl(&r,&s);
  ge_p1p1_to_p2(&s,&r);
  ge_p2_dbl(&r,&s);
  ge_p1p1_to_p2(&s,&r);
  ge_p2_dbl(&r,&s);
  ge_p1p1_to_p3(h,&r);
  __readfds = (fd_set *)0x0;
  for (uVar6 = 0; uVar6 < 0x40; uVar6 = uVar6 + 2) {
    select((int)&t,__readfds,(fd_set *)(ulong)(uint)(int)e[uVar6],__exceptfds,in_R8);
    ge_madd(&r,h,&t);
    ge_p1p1_to_p3(h,&r);
    __readfds = (fd_set *)(ulong)((int)__readfds + 1);
  }
  return;
}

Assistant:

void ge_scalarmult_base(ge_p3 *h, const unsigned char *a) {
    signed char e[64];
    signed char carry;
    ge_p1p1 r;
    ge_p2 s;
    ge_precomp t;
    int i;

    for (i = 0; i < 32; ++i) {
        e[2 * i + 0] = (a[i] >> 0) & 15;
        e[2 * i + 1] = (a[i] >> 4) & 15;
    }

    /* each e[i] is between 0 and 15 */
    /* e[63] is between 0 and 7 */
    carry = 0;

    for (i = 0; i < 63; ++i) {
        e[i] += carry;
        carry = e[i] + 8;
        carry >>= 4;
        e[i] -= carry << 4;
    }

    e[63] += carry;
    /* each e[i] is between -8 and 8 */
    ge_p3_0(h);

    for (i = 1; i < 64; i += 2) {
        select(&t, i / 2, e[i]);
        ge_madd(&r, h, &t);
        ge_p1p1_to_p3(h, &r);
    }

    ge_p3_dbl(&r, h);
    ge_p1p1_to_p2(&s, &r);
    ge_p2_dbl(&r, &s);
    ge_p1p1_to_p2(&s, &r);
    ge_p2_dbl(&r, &s);
    ge_p1p1_to_p2(&s, &r);
    ge_p2_dbl(&r, &s);
    ge_p1p1_to_p3(h, &r);

    for (i = 0; i < 64; i += 2) {
        select(&t, i / 2, e[i]);
        ge_madd(&r, h, &t);
        ge_p1p1_to_p3(h, &r);
    }
}